

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_tpl_dealloc(AV1TplRowMultiThreadSync *tpl_sync)

{
  long lVar1;
  long lVar2;
  
  if (tpl_sync->mutex_ != (pthread_mutex_t *)0x0) {
    if (0 < tpl_sync->rows) {
      lVar1 = 0;
      lVar2 = 0;
      do {
        pthread_mutex_destroy((pthread_mutex_t *)((long)tpl_sync->mutex_ + lVar1));
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x28;
      } while (lVar2 < tpl_sync->rows);
    }
    aom_free(tpl_sync->mutex_);
  }
  if (tpl_sync->cond_ != (pthread_cond_t *)0x0) {
    if (0 < tpl_sync->rows) {
      lVar1 = 0;
      lVar2 = 0;
      do {
        pthread_cond_destroy((pthread_cond_t *)((long)tpl_sync->cond_ + lVar1));
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0x30;
      } while (lVar2 < tpl_sync->rows);
    }
    aom_free(tpl_sync->cond_);
  }
  aom_free(tpl_sync->num_finished_cols);
  tpl_sync->num_finished_cols = (int *)0x0;
  tpl_sync->sync_range = 0;
  tpl_sync->rows = 0;
  tpl_sync->mutex_ = (pthread_mutex_t *)0x0;
  tpl_sync->cond_ = (pthread_cond_t *)0x0;
  *(undefined8 *)&tpl_sync->num_threads_working = 0;
  return;
}

Assistant:

void av1_tpl_dealloc(AV1TplRowMultiThreadSync *tpl_sync) {
  assert(tpl_sync != NULL);

#if CONFIG_MULTITHREAD
  if (tpl_sync->mutex_ != NULL) {
    for (int i = 0; i < tpl_sync->rows; ++i)
      pthread_mutex_destroy(&tpl_sync->mutex_[i]);
    aom_free(tpl_sync->mutex_);
  }
  if (tpl_sync->cond_ != NULL) {
    for (int i = 0; i < tpl_sync->rows; ++i)
      pthread_cond_destroy(&tpl_sync->cond_[i]);
    aom_free(tpl_sync->cond_);
  }
#endif  // CONFIG_MULTITHREAD

  aom_free(tpl_sync->num_finished_cols);
  // clear the structure as the source of this call may be a resize in which
  // case this call will be followed by an _alloc() which may fail.
  av1_zero(*tpl_sync);
}